

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_14::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  uint16_t *puVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  PixelType PVar5;
  exr_coding_channel_info_t *peVar6;
  size_t sVar7;
  size_t sVar8;
  int32_t *piVar9;
  pointer pDVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  char cVar23;
  undefined1 auVar24 [16];
  ushort uVar25;
  int iVar26;
  DeepSlice *pDVar27;
  Slice *pSVar28;
  pointer pDVar29;
  ArgExc *this_00;
  char *pcVar30;
  IoExc *this_01;
  undefined4 uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  int32_t *piVar35;
  long lVar36;
  long lVar37;
  code *pcVar38;
  long *plVar39;
  undefined *puVar40;
  ushort uVar41;
  float fVar42;
  uint uVar43;
  int32_t iVar44;
  long lVar45;
  exr_decode_pipeline_t *peVar46;
  ulong uVar47;
  long lVar48;
  long *plVar49;
  ulong uVar50;
  int32_t *piVar51;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar67;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar81;
  int iVar84;
  int iVar85;
  undefined1 auVar82 [16];
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int tileY;
  int tileX;
  exr_attr_box2i_t dw;
  stringstream _iex_throw_s;
  int local_200;
  int local_1f8;
  int local_1d8;
  int local_1d4;
  exr_decode_pipeline_t *local_1d0;
  int local_1c8;
  int local_1c4;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  long lVar74;
  
  peVar46 = &this->decoder;
  if (this->first == true) {
    iVar26 = exr_decoding_initialize(ctxt,pn,&this->cinfo,peVar46);
    if (iVar26 == 0) {
      puVar1 = &(this->decoder).decode_flags;
      *(byte *)puVar1 = (byte)*puVar1 | 3;
      this->first = false;
      uVar41 = 0;
LAB_00170043:
      iVar26 = exr_get_data_window(ctxt,pn,&local_1c8);
      if (iVar26 == 0) {
        iVar26 = exr_get_tile_sizes(ctxt,pn,(this->cinfo).level_x,(this->cinfo).level_y,&local_1d4,
                                    &local_1d8);
        if (iVar26 == 0) {
          lVar33 = (long)(this->cinfo).start_x * (long)local_1d4 + (long)local_1c8;
          lVar34 = (long)(this->cinfo).start_y * (long)local_1d8 + (long)local_1c4;
          uVar25 = ((this->decoder).decode_flags & 0xfffb) + (ushort)this->counts_only * 4;
          (this->decoder).decode_flags = uVar25;
          (this->decoder).user_line_begin_skip = 0;
          (this->decoder).user_line_end_ignore = 0;
          if (0 < (this->decoder).channel_count) {
            lVar48 = 0x28;
            lVar45 = 0;
            local_1d0 = peVar46;
            do {
              peVar6 = (this->decoder).channels;
              pDVar27 = DeepFrameBuffer::findSlice(outfb,*(char **)((long)peVar6 + lVar48 + -0x28));
              if ((pDVar27 == (DeepSlice *)0x0) || (*(int *)((long)peVar6 + lVar48 + -0x20) == 0)) {
                *(undefined1 (*) [16])((long)peVar6 + lVar48 + -8) = (undefined1  [16])0x0;
              }
              else {
                if (((pDVar27->super_Slice).xSampling != 1) ||
                   ((pDVar27->super_Slice).ySampling != 1)) {
                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                  goto LAB_0017099f;
                }
                lVar36 = lVar33;
                if ((pDVar27->super_Slice).xTileCoords != false) {
                  lVar36 = 0;
                }
                bVar3 = (pDVar27->super_Slice).yTileCoords;
                *(undefined2 *)((long)peVar6 + lVar48 + -0xc) =
                     *(undefined2 *)&(pDVar27->super_Slice).field_0x34;
                *(short *)((long)peVar6 + lVar48 + -10) = (short)(pDVar27->super_Slice).type;
                sVar7 = (pDVar27->super_Slice).xStride;
                *(int *)((long)peVar6 + lVar48 + -8) = (int)sVar7;
                sVar8 = (pDVar27->super_Slice).yStride;
                lVar37 = lVar34;
                if (bVar3 != false) {
                  lVar37 = 0;
                }
                *(int *)((long)peVar6 + lVar48 + -4) = (int)sVar8;
                *(char **)((long)&peVar6->channel_name + lVar48) =
                     (pDVar27->super_Slice).base + lVar37 * sVar8 + lVar36 * sVar7;
              }
              lVar45 = lVar45 + 1;
              lVar48 = lVar48 + 0x30;
            } while (lVar45 < (this->decoder).channel_count);
            uVar25 = (this->decoder).decode_flags;
            peVar46 = local_1d0;
          }
          if ((uVar41 != uVar25) &&
             (iVar26 = exr_decoding_choose_default_routines(ctxt,pn,peVar46), iVar26 != 0)) {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
            goto LAB_00170b17;
          }
          iVar26 = exr_decoding_run(ctxt,pn,peVar46);
          auVar54._8_8_ = extraout_XMM1_Qb;
          auVar54._0_8_ = extraout_XMM1_Qa;
          this->last_decode_err = iVar26;
          if (iVar26 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Unable to run decoder: ",0x17);
            pcVar30 = (char *)exr_get_error_code_as_string(this->last_decode_err);
            std::operator<<(local_1a8,pcVar30);
            this_01 = (IoExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc(this_01,local_1b8);
            __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
          }
          pSVar28 = DeepFrameBuffer::getSampleCountSlice(outfb);
          if ((pSVar28->xSampling == 1) && (pSVar28->ySampling == 1)) {
            iVar26 = (this->cinfo).height;
            local_1f8 = (int)lVar33;
            local_200 = (int)lVar34;
            auVar53 = extraout_XMM0;
            if (0 < iVar26) {
              uVar47 = 0;
              uVar32 = (long)local_1f8;
              if (pSVar28->xTileCoords != false) {
                uVar32 = uVar47;
              }
              sVar7 = pSVar28->xStride;
              sVar8 = pSVar28->yStride;
              uVar50 = (long)local_200;
              if (pSVar28->yTileCoords != false) {
                uVar50 = uVar47;
              }
              piVar51 = (int32_t *)(pSVar28->base + uVar50 * sVar8 + uVar32 * sVar7);
              do {
                iVar26 = (this->cinfo).width;
                piVar9 = (this->decoder).sample_count_table;
                iVar67 = (int)uVar47;
                if (sVar7 == 4) {
                  memcpy(piVar51,piVar9 + (long)iVar67 * (long)iVar26,(long)iVar26 << 2);
                  auVar53 = extraout_XMM0_00;
                }
                else if (0 < iVar26) {
                  lVar33 = 0;
                  piVar35 = piVar51;
                  do {
                    *piVar35 = piVar9[iVar26 * iVar67 + lVar33];
                    piVar35 = (int32_t *)((long)piVar35 + sVar7);
                    lVar33 = lVar33 + 1;
                  } while (lVar33 < (this->cinfo).width);
                }
                piVar51 = (int32_t *)((long)piVar51 + sVar8);
                uVar47 = (ulong)(iVar67 + 1U);
                iVar26 = (this->cinfo).height;
              } while ((int)(iVar67 + 1U) < iVar26);
            }
            auVar24 = _DAT_001b2460;
            if (this->counts_only == false) {
              pDVar29 = (filllist->
                        super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar10 = (filllist->
                        super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pDVar29 != pDVar10) {
                piVar51 = (this->decoder).sample_count_table;
                auVar64 = _DAT_001b3330;
                auVar82 = _DAT_001b3230;
                do {
                  if (((pDVar29->super_Slice).xSampling != 1) ||
                     ((pDVar29->super_Slice).ySampling != 1)) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                    goto LAB_0017099f;
                  }
                  if (0 < iVar26) {
                    sVar7 = (pDVar29->super_Slice).xStride;
                    lVar33 = (long)local_1f8;
                    if ((pDVar29->super_Slice).xTileCoords != false) {
                      lVar33 = 0;
                    }
                    sVar8 = (pDVar29->super_Slice).yStride;
                    lVar34 = (long)local_200;
                    if ((pDVar29->super_Slice).yTileCoords != false) {
                      lVar34 = 0;
                    }
                    plVar49 = (long *)((pDVar29->super_Slice).base + lVar34 * sVar8 + lVar33 * sVar7
                                      );
                    iVar44 = (this->cinfo).width;
                    lVar33 = 0;
                    do {
                      if (0 < iVar44) {
                        lVar34 = (long)iVar44;
                        lVar45 = 0;
                        plVar39 = plVar49;
                        auVar52 = auVar82;
                        do {
                          uVar4 = piVar51[lVar34 * lVar33 + lVar45];
                          uVar32 = (ulong)uVar4;
                          auVar82 = auVar52;
                          if ((uVar32 != 0) && (lVar48 = *plVar39, lVar48 != 0)) {
                            PVar5 = (pDVar29->super_Slice).type;
                            if (PVar5 == FLOAT) {
                              if (0 < (int)uVar4) {
                                fVar42 = (float)(pDVar29->super_Slice).fillValue;
                                lVar36 = uVar32 - 1;
                                auVar73._8_4_ = (int)lVar36;
                                auVar73._0_8_ = lVar36;
                                auVar73._12_4_ = (int)((ulong)lVar36 >> 0x20);
                                auVar73 = auVar73 ^ auVar24;
                                lVar36 = 0;
                                auVar76 = auVar52;
                                auVar78 = auVar64;
                                do {
                                  auVar54 = auVar76 ^ auVar24;
                                  iVar26 = auVar73._4_4_;
                                  iVar67 = auVar73._12_4_;
                                  if ((bool)(~(auVar54._4_4_ == iVar26 &&
                                               auVar73._0_4_ < auVar54._0_4_ ||
                                              iVar26 < auVar54._4_4_) & 1)) {
                                    *(float *)(lVar48 + lVar36) = fVar42;
                                  }
                                  if ((auVar54._12_4_ != iVar67 || auVar54._8_4_ <= auVar73._8_4_)
                                      && auVar54._12_4_ <= iVar67) {
                                    *(float *)(lVar48 + 4 + lVar36) = fVar42;
                                  }
                                  auVar52 = auVar78 ^ auVar24;
                                  auVar54._0_4_ = -(uint)(auVar73._0_4_ < auVar52._0_4_);
                                  auVar54._4_4_ = -(uint)(iVar26 < auVar52._4_4_);
                                  auVar54._8_4_ = -(uint)(auVar73._8_4_ < auVar52._8_4_);
                                  auVar54._12_4_ = -(uint)(iVar67 < auVar52._12_4_);
                                  auVar53._4_4_ = -(uint)(auVar52._4_4_ == iVar26);
                                  auVar53._12_4_ = -(uint)(auVar52._12_4_ == iVar67);
                                  auVar53._0_4_ = auVar53._4_4_;
                                  auVar53._8_4_ = auVar53._12_4_;
                                  auVar53 = auVar53 & auVar54;
                                  auVar62._4_4_ = auVar54._4_4_;
                                  auVar62._0_4_ = auVar54._4_4_;
                                  auVar62._8_4_ = auVar54._12_4_;
                                  auVar62._12_4_ = auVar54._12_4_;
                                  auVar63._8_4_ = 0xffffffff;
                                  auVar63._0_8_ = 0xffffffffffffffff;
                                  auVar63._12_4_ = 0xffffffff;
                                  auVar63 = (auVar62 | auVar53) ^ auVar63;
                                  if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(float *)(lVar48 + 8 + lVar36) = fVar42;
                                  }
                                  if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(float *)(lVar48 + 0xc + lVar36) = fVar42;
                                  }
                                  lVar37 = auVar76._8_8_;
                                  auVar76._0_8_ = auVar76._0_8_ + 4;
                                  auVar76._8_8_ = lVar37 + 4;
                                  lVar37 = auVar78._8_8_;
                                  auVar78._0_8_ = auVar78._0_8_ + 4;
                                  auVar78._8_8_ = lVar37 + 4;
                                  lVar36 = lVar36 + 0x10;
                                } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar36);
                              }
                            }
                            else if (PVar5 == HALF) {
                              fVar61 = (float)(pDVar29->super_Slice).fillValue;
                              fVar42 = ABS(fVar61);
                              uVar41 = (ushort)((uint)fVar61 >> 0x10) & 0x8000;
                              if ((uint)fVar42 < 0x38800000) {
                                if ((0x33000000 < (uint)fVar42) &&
                                   (uVar43 = (uint)fVar42 & 0x7fffff | 0x800000,
                                   cVar23 = (char)((uint)fVar42 >> 0x17),
                                   uVar41 = uVar41 | (ushort)(uVar43 >> (0x7eU - cVar23 & 0x1f)),
                                   0x80000000 < uVar43 << (cVar23 + 0xa2U & 0x1f))) {
                                  uVar41 = uVar41 + 1;
                                }
                              }
                              else if ((uint)fVar42 < 0x7f800000) {
                                if ((uint)fVar42 < 0x477ff000) {
                                  uVar41 = (ushort)((int)fVar42 + 0x8000fff +
                                                    (uint)(((uint)fVar42 >> 0xd & 1) != 0) >> 0xd) |
                                           uVar41;
                                }
                                else {
                                  uVar41 = uVar41 | 0x7c00;
                                }
                              }
                              else {
                                uVar41 = uVar41 | 0x7c00;
                                if (fVar42 != INFINITY) {
                                  uVar43 = (uint)fVar42 >> 0xd & 0x3ff;
                                  uVar41 = uVar41 | (ushort)uVar43 | (ushort)(uVar43 == 0);
                                }
                              }
                              if (0 < (int)uVar4) {
                                lVar36 = uVar32 - 1;
                                lVar37 = 0;
                                auVar77 = auVar64;
                                auVar79 = _DAT_001b3360;
                                auVar80 = _DAT_001b3350;
                                do {
                                  auVar82._8_4_ = (int)lVar36;
                                  auVar82._0_8_ = lVar36;
                                  auVar82._12_4_ = (int)((ulong)lVar36 >> 0x20);
                                  auVar82 = auVar82 ^ auVar24;
                                  auVar64 = auVar52 ^ auVar24;
                                  iVar81 = auVar82._0_4_;
                                  iVar68 = -(uint)(iVar81 < auVar64._0_4_);
                                  iVar84 = auVar82._4_4_;
                                  iVar69 = -(uint)(iVar84 < auVar64._4_4_);
                                  iVar85 = auVar82._8_4_;
                                  iVar70 = -(uint)(iVar85 < auVar64._8_4_);
                                  iVar86 = auVar82._12_4_;
                                  iVar71 = -(uint)(iVar86 < auVar64._12_4_);
                                  auVar17._4_4_ = iVar68;
                                  auVar17._0_4_ = iVar68;
                                  auVar17._8_4_ = iVar70;
                                  auVar17._12_4_ = iVar70;
                                  auVar53 = pshuflw(auVar53,auVar17,0xe8);
                                  iVar26 = -(uint)(auVar64._4_4_ == iVar84);
                                  iVar67 = -(uint)(auVar64._12_4_ == iVar86);
                                  auVar87._4_4_ = iVar26;
                                  auVar87._0_4_ = iVar26;
                                  auVar87._8_4_ = iVar67;
                                  auVar87._12_4_ = iVar67;
                                  auVar82 = pshuflw(auVar54,auVar87,0xe8);
                                  auVar88._4_4_ = iVar69;
                                  auVar88._0_4_ = iVar69;
                                  auVar88._8_4_ = iVar71;
                                  auVar88._12_4_ = iVar71;
                                  auVar54 = pshuflw(auVar53,auVar88,0xe8);
                                  auVar64._8_4_ = 0xffffffff;
                                  auVar64._0_8_ = 0xffffffffffffffff;
                                  auVar64._12_4_ = 0xffffffff;
                                  auVar64 = (auVar54 | auVar82 & auVar53) ^ auVar64;
                                  auVar54 = packssdw(auVar64,auVar64);
                                  if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + lVar37) = uVar41;
                                  }
                                  auVar18._4_4_ = iVar68;
                                  auVar18._0_4_ = iVar68;
                                  auVar18._8_4_ = iVar70;
                                  auVar18._12_4_ = iVar70;
                                  auVar88 = auVar87 & auVar18 | auVar88;
                                  auVar54 = packssdw(auVar88,auVar88);
                                  auVar11._8_4_ = 0xffffffff;
                                  auVar11._0_8_ = 0xffffffffffffffff;
                                  auVar11._12_4_ = 0xffffffff;
                                  auVar54 = packssdw(auVar54 ^ auVar11,auVar54 ^ auVar11);
                                  if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
                                    *(ushort *)(lVar48 + 2 + lVar37) = uVar41;
                                  }
                                  auVar54 = auVar77 ^ auVar24;
                                  auVar58._0_4_ = -(uint)(iVar81 < auVar54._0_4_);
                                  auVar58._4_4_ = -(uint)(iVar84 < auVar54._4_4_);
                                  auVar58._8_4_ = -(uint)(iVar85 < auVar54._8_4_);
                                  auVar58._12_4_ = -(uint)(iVar86 < auVar54._12_4_);
                                  auVar89._4_4_ = auVar58._0_4_;
                                  auVar89._0_4_ = auVar58._0_4_;
                                  auVar89._8_4_ = auVar58._8_4_;
                                  auVar89._12_4_ = auVar58._8_4_;
                                  iVar26 = -(uint)(auVar54._4_4_ == iVar84);
                                  iVar67 = -(uint)(auVar54._12_4_ == iVar86);
                                  auVar19._4_4_ = iVar26;
                                  auVar19._0_4_ = iVar26;
                                  auVar19._8_4_ = iVar67;
                                  auVar19._12_4_ = iVar67;
                                  auVar65._4_4_ = auVar58._4_4_;
                                  auVar65._0_4_ = auVar58._4_4_;
                                  auVar65._8_4_ = auVar58._12_4_;
                                  auVar65._12_4_ = auVar58._12_4_;
                                  auVar54 = auVar19 & auVar89 | auVar65;
                                  auVar54 = packssdw(auVar54,auVar54);
                                  auVar12._8_4_ = 0xffffffff;
                                  auVar12._0_8_ = 0xffffffffffffffff;
                                  auVar12._12_4_ = 0xffffffff;
                                  auVar54 = packssdw(auVar54 ^ auVar12,auVar54 ^ auVar12);
                                  if ((auVar54 & (undefined1  [16])0x100000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + 4 + lVar37) = uVar41;
                                  }
                                  auVar54 = pshufhw(auVar54,auVar89,0x84);
                                  auVar20._4_4_ = iVar26;
                                  auVar20._0_4_ = iVar26;
                                  auVar20._8_4_ = iVar67;
                                  auVar20._12_4_ = iVar67;
                                  auVar64 = pshufhw(auVar58,auVar20,0x84);
                                  auVar53 = pshufhw(auVar54,auVar65,0x84);
                                  auVar55._8_4_ = 0xffffffff;
                                  auVar55._0_8_ = 0xffffffffffffffff;
                                  auVar55._12_4_ = 0xffffffff;
                                  auVar55 = (auVar53 | auVar64 & auVar54) ^ auVar55;
                                  auVar54 = packssdw(auVar55,auVar55);
                                  if ((auVar54 & (undefined1  [16])0x1000000000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + 6 + lVar37) = uVar41;
                                  }
                                  auVar54 = auVar79 ^ auVar24;
                                  auVar59._0_4_ = -(uint)(iVar81 < auVar54._0_4_);
                                  auVar59._4_4_ = -(uint)(iVar84 < auVar54._4_4_);
                                  auVar59._8_4_ = -(uint)(iVar85 < auVar54._8_4_);
                                  auVar59._12_4_ = -(uint)(iVar86 < auVar54._12_4_);
                                  auVar21._4_4_ = auVar59._0_4_;
                                  auVar21._0_4_ = auVar59._0_4_;
                                  auVar21._8_4_ = auVar59._8_4_;
                                  auVar21._12_4_ = auVar59._8_4_;
                                  auVar64 = pshuflw(auVar65,auVar21,0xe8);
                                  auVar56._0_4_ = -(uint)(auVar54._0_4_ == iVar81);
                                  auVar56._4_4_ = -(uint)(auVar54._4_4_ == iVar84);
                                  auVar56._8_4_ = -(uint)(auVar54._8_4_ == iVar85);
                                  auVar56._12_4_ = -(uint)(auVar54._12_4_ == iVar86);
                                  auVar90._4_4_ = auVar56._4_4_;
                                  auVar90._0_4_ = auVar56._4_4_;
                                  auVar90._8_4_ = auVar56._12_4_;
                                  auVar90._12_4_ = auVar56._12_4_;
                                  auVar54 = pshuflw(auVar56,auVar90,0xe8);
                                  auVar91._4_4_ = auVar59._4_4_;
                                  auVar91._0_4_ = auVar59._4_4_;
                                  auVar91._8_4_ = auVar59._12_4_;
                                  auVar91._12_4_ = auVar59._12_4_;
                                  auVar53 = pshuflw(auVar59,auVar91,0xe8);
                                  auVar13._8_4_ = 0xffffffff;
                                  auVar13._0_8_ = 0xffffffffffffffff;
                                  auVar13._12_4_ = 0xffffffff;
                                  auVar54 = packssdw(auVar54 & auVar64,
                                                     (auVar53 | auVar54 & auVar64) ^ auVar13);
                                  if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + 8 + lVar37) = uVar41;
                                  }
                                  auVar22._4_4_ = auVar59._0_4_;
                                  auVar22._0_4_ = auVar59._0_4_;
                                  auVar22._8_4_ = auVar59._8_4_;
                                  auVar22._12_4_ = auVar59._8_4_;
                                  auVar91 = auVar90 & auVar22 | auVar91;
                                  auVar53 = packssdw(auVar91,auVar91);
                                  auVar14._8_4_ = 0xffffffff;
                                  auVar14._0_8_ = 0xffffffffffffffff;
                                  auVar14._12_4_ = 0xffffffff;
                                  auVar54 = packssdw(auVar54,auVar53 ^ auVar14);
                                  if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0
                                     ) {
                                    *(ushort *)(lVar48 + 10 + lVar37) = uVar41;
                                  }
                                  auVar54 = auVar80 ^ auVar24;
                                  auVar60._0_4_ = -(uint)(iVar81 < auVar54._0_4_);
                                  auVar60._4_4_ = -(uint)(iVar84 < auVar54._4_4_);
                                  auVar60._8_4_ = -(uint)(iVar85 < auVar54._8_4_);
                                  auVar60._12_4_ = -(uint)(iVar86 < auVar54._12_4_);
                                  auVar92._4_4_ = auVar60._0_4_;
                                  auVar92._0_4_ = auVar60._0_4_;
                                  auVar92._8_4_ = auVar60._8_4_;
                                  auVar92._12_4_ = auVar60._8_4_;
                                  iVar26 = -(uint)(auVar54._4_4_ == iVar84);
                                  iVar67 = -(uint)(auVar54._12_4_ == iVar86);
                                  auVar66._4_4_ = iVar26;
                                  auVar66._0_4_ = iVar26;
                                  auVar66._8_4_ = iVar67;
                                  auVar66._12_4_ = iVar67;
                                  auVar83._4_4_ = auVar60._4_4_;
                                  auVar83._0_4_ = auVar60._4_4_;
                                  auVar83._8_4_ = auVar60._12_4_;
                                  auVar83._12_4_ = auVar60._12_4_;
                                  auVar54 = auVar66 & auVar92 | auVar83;
                                  auVar54 = packssdw(auVar54,auVar54);
                                  auVar15._8_4_ = 0xffffffff;
                                  auVar15._0_8_ = 0xffffffffffffffff;
                                  auVar15._12_4_ = 0xffffffff;
                                  auVar54 = packssdw(auVar54 ^ auVar15,auVar54 ^ auVar15);
                                  if ((auVar54 & (undefined1  [16])0x100000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + 0xc + lVar37) = uVar41;
                                  }
                                  auVar53 = pshufhw(auVar54,auVar92,0x84);
                                  auVar54 = pshufhw(auVar60,auVar66,0x84);
                                  auVar54 = auVar54 & auVar53;
                                  auVar53 = pshufhw(auVar53,auVar83,0x84);
                                  auVar57._8_4_ = 0xffffffff;
                                  auVar57._0_8_ = 0xffffffffffffffff;
                                  auVar57._12_4_ = 0xffffffff;
                                  auVar57 = (auVar53 | auVar54) ^ auVar57;
                                  auVar53 = packssdw(auVar57,auVar57);
                                  if ((auVar53 & (undefined1  [16])0x1000000000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar48 + 0xe + lVar37) = uVar41;
                                  }
                                  lVar74 = auVar52._8_8_;
                                  auVar52._0_8_ = auVar52._0_8_ + 8;
                                  auVar52._8_8_ = lVar74 + 8;
                                  lVar74 = auVar77._8_8_;
                                  auVar77._0_8_ = auVar77._0_8_ + 8;
                                  auVar77._8_8_ = lVar74 + 8;
                                  lVar74 = auVar79._8_8_;
                                  auVar79._0_8_ = auVar79._0_8_ + 8;
                                  auVar79._8_8_ = lVar74 + 8;
                                  lVar74 = auVar80._8_8_;
                                  auVar80._0_8_ = auVar80._0_8_ + 8;
                                  auVar80._8_8_ = lVar74 + 8;
                                  lVar37 = lVar37 + 0x10;
                                  auVar64 = _DAT_001b3330;
                                  auVar82 = _DAT_001b3230;
                                } while ((ulong)(uVar4 + 7 >> 3) << 4 != lVar37);
                              }
                            }
                            else {
                              if (PVar5 != UINT) {
                                this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                                goto LAB_0017099f;
                              }
                              if (0 < (int)uVar4) {
                                dVar2 = (pDVar29->super_Slice).fillValue;
                                lVar36 = uVar32 - 1;
                                lVar37 = 0;
                                auVar72 = auVar52;
                                auVar75 = auVar64;
                                do {
                                  auVar16._8_4_ = (int)lVar36;
                                  auVar16._0_8_ = lVar36;
                                  auVar16._12_4_ = (int)((ulong)lVar36 >> 0x20);
                                  iVar26 = SUB164(auVar16 ^ auVar24,0);
                                  bVar3 = iVar26 < SUB164(auVar72 ^ auVar24,0);
                                  iVar67 = SUB164(auVar16 ^ auVar24,4);
                                  iVar68 = SUB164(auVar72 ^ auVar24,4);
                                  uVar31 = (undefined4)(long)dVar2;
                                  if ((bool)(~(iVar67 < iVar68 || iVar68 == iVar67 && bVar3) & 1)) {
                                    *(undefined4 *)(lVar48 + lVar37) = uVar31;
                                  }
                                  if (iVar67 >= iVar68 && (iVar68 != iVar67 || !bVar3)) {
                                    *(undefined4 *)(lVar48 + 4 + lVar37) = uVar31;
                                  }
                                  iVar68 = SUB164(auVar75 ^ auVar24,4);
                                  if (iVar68 <= iVar67 &&
                                      (iVar68 != iVar67 || SUB164(auVar75 ^ auVar24,0) <= iVar26)) {
                                    *(undefined4 *)(lVar48 + 8 + lVar37) = uVar31;
                                    *(undefined4 *)(lVar48 + 0xc + lVar37) = uVar31;
                                  }
                                  lVar74 = auVar72._8_8_;
                                  auVar72._0_8_ = auVar72._0_8_ + 4;
                                  auVar72._8_8_ = lVar74 + 4;
                                  lVar74 = auVar75._8_8_;
                                  auVar75._0_8_ = auVar75._0_8_ + 4;
                                  auVar75._8_8_ = lVar74 + 4;
                                  lVar37 = lVar37 + 0x10;
                                } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar37);
                                iVar44 = (this->cinfo).width;
                              }
                            }
                          }
                          plVar39 = (long *)((long)plVar39 + sVar7);
                          lVar45 = lVar45 + 1;
                          auVar52 = auVar82;
                        } while (lVar45 < iVar44);
                        iVar26 = (this->cinfo).height;
                      }
                      plVar49 = (long *)((long)plVar49 + sVar8);
                      lVar33 = lVar33 + 1;
                    } while (lVar33 < iVar26);
                  }
                  pDVar29 = pDVar29 + 1;
                } while (pDVar29 != pDVar10);
              }
            }
            return;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_0017099f:
      puVar40 = &Iex_3_4::ArgExc::typeinfo;
      pcVar38 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_001709ad;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar26 = exr_decoding_update(ctxt,pn,&this->cinfo,peVar46);
    if (iVar26 == 0) {
      uVar41 = (ushort)(byte)(this->decoder).decode_flags;
      goto LAB_00170043;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_00170b17:
  puVar40 = &Iex_3_4::IoExc::typeinfo;
  pcVar38 = Iex_3_4::IoExc::~IoExc;
LAB_001709ad:
  __cxa_throw(this_00,puVar40,pcVar38);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    const std::vector<DeepSlice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
    {
        THROW (
            IEX_NAMESPACE::IoExc,
            "Unable to run decoder: "
            << exr_get_error_code_as_string (last_decode_err));
    }

    copy_sample_count (outfb, dw.min.x, dw.min.y, absX, absY);

    if (counts_only)
        return;

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}